

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_0::deviceQueueFamilyProperties2
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  PlatformInterface *vkp;
  VkPhysicalDevice physicalDevice;
  TestStatus *pTVar5;
  void **ppvVar6;
  VkQueueFamilyProperties *pVVar7;
  TestError *pTVar8;
  long lVar9;
  VkQueueFamilyProperties *pVVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  deUint32 numExtQueueFamilies;
  deUint32 numCoreQueueFamilies;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> coreProperties;
  vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
  extProperties;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  InstanceDriver vki;
  deUint32 local_22c;
  deUint32 local_228;
  allocator_type local_221;
  undefined1 local_220 [32];
  VkQueueFamilyProperties2KHR *local_200;
  VkQueueFamilyProperties2KHR *local_1f8;
  long local_1f0;
  VkAllocationCallbacks *local_1e8;
  DestroyInstanceFunc local_1e0;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_1d8;
  TestStatus *local_1c0;
  InstanceDriver local_1b8;
  
  vkp = *(PlatformInterface **)(this + 8);
  createInstanceWithExtension((Move<vk::VkInstance_s_*> *)&local_1b8,vkp,(char *)context);
  local_1e0 = local_1b8.m_vk.destroyInstance;
  local_1e8 = (VkAllocationCallbacks *)local_1b8.m_vk.enumeratePhysicalDevices;
  ::vk::InstanceDriver::InstanceDriver
            (&local_1b8,vkp,(VkInstance)local_1b8.super_InstanceInterface._vptr_InstanceInterface);
  local_1c0 = __return_storage_ptr__;
  ::vk::enumeratePhysicalDevices
            (&local_1d8,&local_1b8.super_InstanceInterface,
             (VkInstance)local_1b8.super_InstanceInterface._vptr_InstanceInterface);
  if (local_1d8.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1d8.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      physicalDevice =
           local_1d8.
           super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar11];
      local_228 = 0xffffffff;
      local_22c = 0xffffffff;
      ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties
                (&local_1b8,physicalDevice,&local_228,(VkQueueFamilyProperties *)0x0);
      ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties2KHR
                (&local_1b8,physicalDevice,&local_22c,(VkQueueFamilyProperties2KHR *)0x0);
      if (local_228 != local_22c) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Different number of queue family properties reported",
                   "numCoreQueueFamilies == numExtQueueFamilies",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x918);
LAB_0044b882:
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if ((ulong)local_228 == 0) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,(char *)0x0,"numCoreQueueFamilies > 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x919);
        goto LAB_0044b882;
      }
      std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::vector
                ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                  *)local_220,(ulong)local_228,(allocator_type *)&local_200);
      std::vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
      ::vector((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                *)&local_200,(ulong)local_22c,&local_221);
      memset((void *)local_220._0_8_,0xcd,(ulong)local_228 * 0x18);
      memset(local_200,0xcd,(ulong)local_22c * 0x28);
      if ((long)local_1f8 - (long)local_200 != 0) {
        lVar9 = ((long)local_1f8 - (long)local_200 >> 3) * -0x3333333333333333;
        lVar9 = lVar9 + (ulong)(lVar9 == 0);
        ppvVar6 = &local_200->pNext;
        do {
          ((VkQueueFamilyProperties2KHR *)(ppvVar6 + -1))->sType =
               VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR;
          *ppvVar6 = (void *)0x0;
          ppvVar6 = ppvVar6 + 5;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties
                (&local_1b8,physicalDevice,&local_228,(VkQueueFamilyProperties *)local_220._0_8_);
      ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties2KHR
                (&local_1b8,physicalDevice,&local_22c,local_200);
      if (((long)(local_220._8_8_ - local_220._0_8_) >> 3) * -0x5555555555555555 - (ulong)local_228
          != 0) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,(char *)0x0,"(size_t)numCoreQueueFamilies == coreProperties.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x92b);
LAB_0044b80f:
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      lVar9 = ((long)local_1f8 - (long)local_200 >> 3) * -0x3333333333333333;
      if (lVar9 - (ulong)local_22c != 0) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,(char *)0x0,"(size_t)numExtQueueFamilies == extProperties.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x92c);
        goto LAB_0044b80f;
      }
      if (local_1f8 != local_200) {
        lVar9 = lVar9 + (ulong)(lVar9 == 0);
        pVVar10 = &local_200->queueFamilyProperties;
        pVVar7 = (VkQueueFamilyProperties *)local_220._0_8_;
        do {
          if (*(int *)((long)(pVVar10 + -1) + 8) != 0x3b9bb07d) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,
                       "extProperties[ndx].sType == VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                       ,0x931);
LAB_0044b79d:
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          if (*(long *)((long)(pVVar10 + -1) + 0x10) != 0) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,"extProperties[ndx].pNext == DE_NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                       ,0x932);
            goto LAB_0044b79d;
          }
          auVar12[0] = -((char)pVVar10->queueFlags == (char)pVVar7->queueFlags);
          auVar12[1] = -(*(char *)((long)&pVVar10->queueFlags + 1) ==
                        *(char *)((long)&pVVar7->queueFlags + 1));
          auVar12[2] = -(*(char *)((long)&pVVar10->queueFlags + 2) ==
                        *(char *)((long)&pVVar7->queueFlags + 2));
          auVar12[3] = -(*(char *)((long)&pVVar10->queueFlags + 3) ==
                        *(char *)((long)&pVVar7->queueFlags + 3));
          auVar12[4] = -((char)pVVar10->queueCount == (char)pVVar7->queueCount);
          auVar12[5] = -(*(char *)((long)&pVVar10->queueCount + 1) ==
                        *(char *)((long)&pVVar7->queueCount + 1));
          auVar12[6] = -(*(char *)((long)&pVVar10->queueCount + 2) ==
                        *(char *)((long)&pVVar7->queueCount + 2));
          auVar12[7] = -(*(char *)((long)&pVVar10->queueCount + 3) ==
                        *(char *)((long)&pVVar7->queueCount + 3));
          auVar12[8] = -((char)pVVar10->timestampValidBits == (char)pVVar7->timestampValidBits);
          auVar12[9] = -(*(char *)((long)&pVVar10->timestampValidBits + 1) ==
                        *(char *)((long)&pVVar7->timestampValidBits + 1));
          auVar12[10] = -(*(char *)((long)&pVVar10->timestampValidBits + 2) ==
                         *(char *)((long)&pVVar7->timestampValidBits + 2));
          auVar12[0xb] = -(*(char *)((long)&pVVar10->timestampValidBits + 3) ==
                          *(char *)((long)&pVVar7->timestampValidBits + 3));
          auVar12[0xc] = -((char)(pVVar10->minImageTransferGranularity).width ==
                          (char)(pVVar7->minImageTransferGranularity).width);
          auVar12[0xd] = -(*(char *)((long)&(pVVar10->minImageTransferGranularity).width + 1) ==
                          *(char *)((long)&(pVVar7->minImageTransferGranularity).width + 1));
          auVar12[0xe] = -(*(char *)((long)&(pVVar10->minImageTransferGranularity).width + 2) ==
                          *(char *)((long)&(pVVar7->minImageTransferGranularity).width + 2));
          auVar12[0xf] = -(*(char *)((long)&(pVVar10->minImageTransferGranularity).width + 3) ==
                          *(char *)((long)&(pVVar7->minImageTransferGranularity).width + 3));
          uVar1 = (pVVar7->minImageTransferGranularity).height;
          uVar3 = (pVVar7->minImageTransferGranularity).depth;
          uVar2 = (pVVar10->minImageTransferGranularity).height;
          uVar4 = (pVVar10->minImageTransferGranularity).depth;
          auVar13[0] = -((char)uVar2 == (char)uVar1);
          auVar13[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
          auVar13[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
          auVar13[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
          auVar13[4] = -((char)uVar4 == (char)uVar3);
          auVar13[5] = -((char)((uint)uVar4 >> 8) == (char)((uint)uVar3 >> 8));
          auVar13[6] = -((char)((uint)uVar4 >> 0x10) == (char)((uint)uVar3 >> 0x10));
          auVar13[7] = -((char)((uint)uVar4 >> 0x18) == (char)((uint)uVar3 >> 0x18));
          auVar13[8] = 0xff;
          auVar13[9] = 0xff;
          auVar13[10] = 0xff;
          auVar13[0xb] = 0xff;
          auVar13[0xc] = 0xff;
          auVar13[0xd] = 0xff;
          auVar13[0xe] = 0xff;
          auVar13[0xf] = 0xff;
          auVar13 = auVar13 & auVar12;
          if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,
                       "Mismatch between format properties reported by vkGetPhysicalDeviceQueueFamilyProperties and vkGetPhysicalDeviceQueueFamilyProperties2KHR"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                       ,0x935);
            goto LAB_0044b79d;
          }
          pVVar10 = (VkQueueFamilyProperties *)((long)(pVVar10 + 1) + 0x10);
          pVVar7 = pVVar7 + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      if (local_200 != (VkQueueFamilyProperties2KHR *)0x0) {
        operator_delete(local_200,local_1f0 - (long)local_200);
      }
      if ((VkQueueFamilyProperties *)local_220._0_8_ != (VkQueueFamilyProperties *)0x0) {
        operator_delete((void *)local_220._0_8_,local_220._16_8_ - local_220._0_8_);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)local_1d8.
                                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1d8.
                                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_220._0_8_ = (pointer)(local_220 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"Querying device queue family properties succeeded","");
  pTVar5 = local_1c0;
  local_1c0->m_code = QP_TEST_RESULT_PASS;
  (local_1c0->m_description)._M_dataplus._M_p = (pointer)&(local_1c0->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0->m_description,local_220._0_8_,
             (undefined1 *)
             ((long)(VkQueueFlags *)local_220._0_8_ + (long)(VkQueueFlags *)local_220._8_8_));
  if ((pointer)local_220._0_8_ != (pointer)(local_220 + 0x10)) {
    operator_delete((void *)local_220._0_8_,(ulong)((long)(VkQueueFlags *)local_220._16_8_ + 1));
  }
  if (local_1d8.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
  if ((VkInstance)local_1b8.super_InstanceInterface._vptr_InstanceInterface != (VkInstance)0x0) {
    (*local_1e0)((VkInstance)local_1b8.super_InstanceInterface._vptr_InstanceInterface,local_1e8);
  }
  return pTVar5;
}

Assistant:

tcu::TestStatus deviceQueueFamilyProperties2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		const VkPhysicalDevice	physicalDevice			= devices[deviceNdx];
		deUint32				numCoreQueueFamilies	= ~0u;
		deUint32				numExtQueueFamilies		= ~0u;

		vki.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &numCoreQueueFamilies, DE_NULL);
		vki.getPhysicalDeviceQueueFamilyProperties2KHR(physicalDevice, &numExtQueueFamilies, DE_NULL);

		TCU_CHECK_MSG(numCoreQueueFamilies == numExtQueueFamilies, "Different number of queue family properties reported");
		TCU_CHECK(numCoreQueueFamilies > 0);

		{
			std::vector<VkQueueFamilyProperties>		coreProperties	(numCoreQueueFamilies);
			std::vector<VkQueueFamilyProperties2KHR>	extProperties	(numExtQueueFamilies);

			deMemset(&coreProperties[0], 0xcd, sizeof(VkQueueFamilyProperties)*numCoreQueueFamilies);
			deMemset(&extProperties[0], 0xcd, sizeof(VkQueueFamilyProperties2KHR)*numExtQueueFamilies);

			for (size_t ndx = 0; ndx < extProperties.size(); ++ndx)
			{
				extProperties[ndx].sType = VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR;
				extProperties[ndx].pNext = DE_NULL;
			}

			vki.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &numCoreQueueFamilies, &coreProperties[0]);
			vki.getPhysicalDeviceQueueFamilyProperties2KHR(physicalDevice, &numExtQueueFamilies, &extProperties[0]);

			TCU_CHECK((size_t)numCoreQueueFamilies == coreProperties.size());
			TCU_CHECK((size_t)numExtQueueFamilies == extProperties.size());
			DE_ASSERT(numCoreQueueFamilies == numExtQueueFamilies);

			for (size_t ndx = 0; ndx < extProperties.size(); ++ndx)
			{
				TCU_CHECK(extProperties[ndx].sType == VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR);
				TCU_CHECK(extProperties[ndx].pNext == DE_NULL);

				if (deMemCmp(&coreProperties[ndx], &extProperties[ndx].queueFamilyProperties, sizeof(VkQueueFamilyProperties)) != 0)
					TCU_FAIL("Mismatch between format properties reported by vkGetPhysicalDeviceQueueFamilyProperties and vkGetPhysicalDeviceQueueFamilyProperties2KHR");
			}
		}
	}

	return tcu::TestStatus::pass("Querying device queue family properties succeeded");
}